

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
SimulationDecPOMDPDiscrete::SimulationDecPOMDPDiscrete
          (SimulationDecPOMDPDiscrete *this,PlanningUnitDecPOMDPDiscrete *pu,Arguments *args)

{
  int iVar1;
  
  (this->super_Simulation)._vptr_Simulation = (_func_int **)&PTR__Simulation_005a8398;
  iVar1 = args->randomSeed;
  (this->super_Simulation)._m_nrRuns = args->nrRuns;
  (this->super_Simulation)._m_random_seed = iVar1;
  (this->super_Simulation)._m_verbose = false;
  (this->super_Simulation)._vptr_Simulation =
       (_func_int **)&PTR__SimulationDecPOMDPDiscrete_005a8348;
  this->_m_pu = pu;
  this->_m_saveIntermediateResults = false;
  (this->_m_intermediateResultsFilename)._M_dataplus._M_p =
       (pointer)&(this->_m_intermediateResultsFilename).field_2;
  (this->_m_intermediateResultsFilename)._M_string_length = 0;
  (this->_m_intermediateResultsFilename).field_2._M_local_buf[0] = '\0';
  if (3 < args->verbose) {
    (this->super_Simulation)._m_verbose = true;
  }
  Initialize(this);
  return;
}

Assistant:

SimulationDecPOMDPDiscrete::
SimulationDecPOMDPDiscrete(const PlanningUnitDecPOMDPDiscrete &pu, 
                           const ArgumentHandlers::Arguments &args) : 
    Simulation(args.nrRuns, args.randomSeed),
    _m_pu(&pu),
    _m_saveIntermediateResults(false)
{
    if(args.verbose >= 4)
        SetVerbose(true);
    Initialize();
}